

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O3

int Abc_NtkCollectPiPos(Abc_Ntk_t *pNtk,Vec_Ptr_t **pvLiMaps,Vec_Ptr_t **pvLoMaps)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  
  if (pNtk->ntkType == ABC_NTK_NETLIST) {
    pVVar2 = (Vec_Ptr_t *)malloc(0x10);
    pVVar2->nCap = 1000;
    pVVar2->nSize = 0;
    ppvVar3 = (void **)malloc(8000);
    pVVar2->pArray = ppvVar3;
    *pvLiMaps = pVVar2;
    pVVar2 = (Vec_Ptr_t *)malloc(0x10);
    pVVar2->nCap = 1000;
    pVVar2->nSize = 0;
    ppvVar3 = (void **)malloc(8000);
    pVVar2->pArray = ppvVar3;
    *pvLoMaps = pVVar2;
    iVar1 = Abc_NtkCollectPiPos_int((Abc_Obj_t *)0x0,pNtk,*pvLiMaps,pVVar2);
    return iVar1;
  }
  __assert_fail("Abc_NtkIsNetlist(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcBarBuf.c"
                ,0x95,"int Abc_NtkCollectPiPos(Abc_Ntk_t *, Vec_Ptr_t **, Vec_Ptr_t **)");
}

Assistant:

int Abc_NtkCollectPiPos( Abc_Ntk_t * pNtk, Vec_Ptr_t ** pvLiMaps, Vec_Ptr_t ** pvLoMaps )
{
    assert( Abc_NtkIsNetlist(pNtk) );
    *pvLiMaps = Vec_PtrAlloc( 1000 );
    *pvLoMaps = Vec_PtrAlloc( 1000 );
    return Abc_NtkCollectPiPos_int( NULL, pNtk, *pvLiMaps, *pvLoMaps );
}